

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall
el::Configurations::setGlobally
          (Configurations *this,ConfigurationType configurationType,string *value,
          bool includeGlobalLevel)

{
  char cVar1;
  undefined7 in_register_00000009;
  EnumType lIndex;
  uint local_48;
  ConfigurationType local_44;
  undefined8 *local_40;
  undefined8 local_38;
  code *local_30;
  code *local_28;
  
  local_44 = configurationType;
  if ((int)CONCAT71(in_register_00000009,includeGlobalLevel) != 0) {
    (*(this->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
      super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
      .super_ThreadSafe._vptr_ThreadSafe[2])(this);
    unsafeSet(this,Global,configurationType,value);
    unsafeSetGlobally(this,configurationType,value,false);
  }
  local_48 = 2;
  local_38 = 0;
  local_40 = (undefined8 *)operator_new(0x20);
  *local_40 = this;
  local_40[1] = &local_48;
  local_40[2] = &local_44;
  local_40[3] = value;
  local_28 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/base/easylogging++.cc:485:38)>
             ::_M_invoke;
  local_30 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/base/easylogging++.cc:485:38)>
             ::_M_manager;
  do {
    cVar1 = (*local_28)(&local_40);
    if ((cVar1 != '\0') || (local_48 = local_48 * 2, 0x80 < local_48)) goto LAB_0010c4f3;
  } while (local_30 != (code *)0x0);
  std::__throw_bad_function_call();
LAB_0010c4f3:
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,3);
  }
  return;
}

Assistant:

void Configurations::setGlobally(ConfigurationType configurationType, const std::string& value,
                                 bool includeGlobalLevel) {
  if (includeGlobalLevel) {
    set(Level::Global, configurationType, value);
  }
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    set(LevelHelper::castFromInt(lIndex), configurationType, value);
    return false;  // Do not break lambda function yet as we need to set all levels regardless
  });
}